

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O1

void __thiscall hello::view_test(hello *this,string *skin)

{
  string *psVar1;
  hello c;
  undefined1 *local_1538 [2];
  undefined1 local_1528 [16];
  hello local_1518;
  
  view::hello::hello(&local_1518);
  if (skin->_M_string_length != 0) {
    psVar1 = (string *)cppcms::application::context();
    cppcms::http::context::skin(psVar1);
  }
  local_1538[0] = local_1528;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1538,"hello","");
  cppcms::application::render(this,local_1538,&local_1518);
  if (local_1538[0] != local_1528) {
    operator_delete(local_1538[0]);
  }
  view::hello::~hello(&local_1518);
  return;
}

Assistant:

void view_test(std::string skin)
	{
		view::hello c;
		if(!skin.empty())
			context().skin(skin);
		render("hello",c);
	}